

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::MultiReporter::assertionEnded(MultiReporter *this,AssertionStats *assertionStats)

{
  pointer puVar1;
  IEventListener *pIVar2;
  int iVar3;
  char cVar4;
  unique_ptr<Catch::IEventListener> *reporterish;
  pointer puVar5;
  
  cVar4 = '\x01';
  if ((assertionStats->assertionResult).m_resultData.resultType == Ok) {
    iVar3 = (*((this->super_IEventListener).m_config)->_vptr_IConfig[4])();
    cVar4 = (char)iVar3;
  }
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->m_reporterLikes).
                super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    pIVar2 = puVar5->m_ptr;
    if ((cVar4 != '\0') || ((pIVar2->m_preferences).shouldReportAllAssertions == true)) {
      (*pIVar2->_vptr_IEventListener[0xd])(pIVar2,assertionStats);
    }
  }
  return;
}

Assistant:

void MultiReporter::assertionEnded( AssertionStats const& assertionStats ) {
        const bool reportByDefault =
            assertionStats.assertionResult.getResultType() != ResultWas::Ok ||
            m_config->includeSuccessfulResults();

        for ( auto & reporterish : m_reporterLikes ) {
            if ( reportByDefault ||
                 reporterish->getPreferences().shouldReportAllAssertions ) {
                    reporterish->assertionEnded( assertionStats );
            }
        }
    }